

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void thumb_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  void *uc;
  TCGContext_conflict1 *pTVar1;
  CPUArchState_conflict1 *env;
  abi_ptr addr;
  DisasContext_conflict1 *pDVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  undefined1 *puVar6;
  long *plVar7;
  long lVar8;
  uint uVar9;
  target_ulong tVar10;
  ulong uVar11;
  uint uVar12;
  target_ulong local_68 [4];
  DisasContext_conflict1 *local_48;
  TCGContext_conflict1 *local_40;
  CPUArchState_conflict1 *local_38;
  
  uc = (void *)dcbase[8].pc_next;
  pTVar1 = *(TCGContext_conflict1 **)((long)uc + 0x2e8);
  env = (CPUArchState_conflict1 *)cpu->env_ptr;
  _Var3 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var3) {
    return;
  }
  local_68[0] = dcbase->pc_next;
  if (*(int *)((long)uc + 0x57c) == 0) {
    if (*(target_ulong *)((long)uc + (long)*(int *)((long)uc + 0x39e0) * 8 + 0x578) == local_68[0])
    goto LAB_00662a56;
  }
  else {
    puVar6 = (undefined1 *)g_tree_lookup(*(GTree **)((long)uc + 0x780),local_68);
    if (puVar6 == &DAT_00000001) {
LAB_00662a56:
      dcbase->is_jmp = DISAS_TARGET_2;
      return;
    }
  }
  addr = dcbase->pc_next;
  dcbase[1].pc_first = addr;
  iVar5 = *(int *)((long)&dcbase[2].pc_first + 4);
  local_40 = pTVar1;
  uVar4 = cpu_lduw_code_aarch64(env,addr);
  uVar9 = (uint)(ushort)((ushort)uVar4 << 8 | (ushort)uVar4 >> 8);
  if (iVar5 == 0) {
    uVar9 = uVar4;
  }
  uVar9 = uVar9 & 0xffff;
  tVar10 = dcbase->pc_next;
  _Var3 = thumb_insn_is_16bit((DisasContext_conflict1 *)dcbase,(uint32_t)tVar10,uVar9);
  tVar10 = tVar10 + 2;
  dcbase->pc_next = tVar10;
  local_48 = (DisasContext_conflict1 *)dcbase;
  local_38 = env;
  if (!_Var3) {
    iVar5 = *(int *)((long)&dcbase[2].pc_first + 4);
    uVar4 = cpu_lduw_code_aarch64(env,tVar10);
    uVar12 = (uint)(ushort)((ushort)uVar4 << 8 | (ushort)uVar4 >> 8);
    if (iVar5 == 0) {
      uVar12 = uVar4;
    }
    uVar9 = uVar9 << 0x10 | uVar12 & 0xffff;
    tVar10 = (local_48->base).pc_next + 2;
    (local_48->base).pc_next = tVar10;
  }
  pDVar2 = local_48;
  local_48->insn = uVar9;
  iVar5 = local_48->condexec_mask;
  if ((iVar5 != 0) && ((uVar9 & 0xffffff00) != 0xbe00)) {
    if ((uVar9 & 0xffffffc0) == 0xba80) {
      if ((local_48->features & 0x8000200) != 0x8000000) {
LAB_00662a7d:
        if ((uint)local_48->condexec_cond < 0xe) {
          arm_skip_unless(local_48,local_48->condexec_cond);
          iVar5 = pDVar2->condexec_mask;
          tVar10 = (pDVar2->base).pc_next;
        }
      }
    }
    else if ((uVar9 != 0xe97fe97f) || ((~(uint)local_48->features & 0x8000200) != 0))
    goto LAB_00662a7d;
  }
  pDVar2 = local_48;
  *(bool *)((long)uc + 0x7da) = iVar5 != 0;
  plVar7 = *(long **)((long)uc + 0x358);
  if (plVar7 != (long *)0x0) {
    uVar12 = (uint)!_Var3 * 2 + 2;
    uVar11 = tVar10 - uVar12;
    do {
      lVar8 = plVar7[1];
      if ((*(ulong *)(lVar8 + 0x20) < *(ulong *)(lVar8 + 0x18) ||
           uVar11 <= *(ulong *)(lVar8 + 0x20) && *(ulong *)(lVar8 + 0x18) <= uVar11) &&
         (*(char *)(lVar8 + 0x14) != '\x01')) {
        pTVar1 = local_48->uc->tcg_ctx;
        tcg_gen_op2_aarch64(pTVar1,INDEX_op_movi_i32,(TCGArg)(pTVar1->cpu_R[0xf] + (long)pTVar1),
                            (long)(int)uVar11);
        pTVar1 = local_40;
        gen_uc_tracecode(local_40,uVar12,(uint)*(byte *)((long)uc + 0x7da) << 6 | 2,uc,
                         (pDVar2->base).pc_next - (ulong)uVar12);
        check_exit_request_aarch64(pTVar1);
        break;
      }
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  pDVar2 = local_48;
  if (_Var3) {
    (*(code *)(&DAT_00d764d4 + *(int *)(&DAT_00d764d4 + (ulong)((uVar9 & 0xffff) >> 0xc) * 4)))();
    return;
  }
  if (((uint)local_48->features & 0x220) == 0x200) {
    lVar8 = 0;
    do {
      if ((*(uint *)((long)&disas_thumb2_insn_armv6m_mask + lVar8) & uVar9) ==
          *(uint *)((long)&disas_thumb2_insn_armv6m_insn + lVar8)) goto LAB_00662c38;
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0x18);
  }
  else if ((uVar9 & 0xf800e800) == 0xf000e800 || (local_48->features & 0x40) != 0) {
LAB_00662c38:
    _Var3 = disas_t32(local_48,uVar9);
    if (((_Var3) || (_Var3 = disas_vfp_uncond(pDVar2,uVar9), _Var3)) ||
       (((uVar9 & 0xf0000000) == 0xe0000000 && (_Var3 = disas_vfp(pDVar2,uVar9), _Var3))))
    goto LAB_00663aab;
    uVar12 = uVar9 >> 0x19 & 0xf;
    if (uVar12 < 0x10) {
      if ((0xc0c0U >> uVar12 & 1) == 0) {
        if (uVar12 == 0xc) {
          if ((uVar9 & 0x1100000) == 0x1000000) {
            iVar5 = disas_neon_ls_insn(pDVar2,uVar9);
            goto LAB_0066359e;
          }
        }
        else if ((0xfU >> uVar12 & 1) != 0) {
          abort();
        }
      }
      else {
        uVar12 = (uint)pDVar2->features;
        if ((uVar12 >> 9 & 1) == 0) {
          if ((uVar12 >> 0x1b & 1) == 0 || (uVar9 & 0xfe000a00) != 0xfc000800) {
            if ((uVar9 & 0xff000a00) == 0xfe000800 && (uVar12 >> 0x1b & 1) != 0) {
              iVar5 = disas_neon_insn_2reg_scalar_ext(pDVar2,uVar9);
            }
            else if ((~uVar9 & 0x3000000) == 0) {
              iVar5 = disas_neon_data_insn
                                (pDVar2,(uVar9 >> 4 & 0x1000000) + (uVar9 & 0xe2ffffff) + 0x10000000
                                );
            }
            else {
              if (((byte)(uVar9 >> 0x1c) & 1) != 0 || (uVar9 & 0xe00) == 0xa00) goto LAB_00662c2b;
              iVar5 = disas_coproc_insn(pDVar2,uVar9);
            }
          }
          else {
            iVar5 = disas_neon_insn_3same_ext(pDVar2,uVar9);
          }
LAB_0066359e:
          if (iVar5 == 0) goto LAB_00663aab;
        }
        else if (((~uVar9 & 0x3000000) != 0) &&
                (((uVar9 & 0xe00) != 0xa00 || ((pDVar2->isar->mvfr0 & 0xf0) == 0)))) {
          if ((pDVar2->mmu_idx != ARMMMUIdx_SE10_0) ||
             (uVar4 = 3, pDVar2->secure_routed_to_el3 == false)) {
            uVar4 = 1;
            if (1 < pDVar2->current_el) {
              uVar4 = pDVar2->current_el;
            }
          }
          gen_exception_insn(pDVar2,(uint32_t)pDVar2->pc_curr,0x11,0x2000000,uVar4);
          goto LAB_00663aab;
        }
      }
    }
  }
LAB_00662c2b:
  unallocated_encoding_aarch64(pDVar2);
LAB_00663aab:
  uVar9 = pDVar2->condexec_mask;
  if (uVar9 != 0) {
    pDVar2->condexec_cond = uVar9 >> 4 & 1 | pDVar2->condexec_cond & 0xeU;
    uVar9 = uVar9 * 2 & 0x1e;
    pDVar2->condexec_mask = uVar9;
    if (uVar9 == 0) {
      pDVar2->condexec_cond = 0;
    }
  }
  arm_post_translate_insn(pDVar2);
  if ((pDVar2->base).is_jmp == DISAS_NEXT) {
    uVar11 = (pDVar2->base).pc_next - pDVar2->page_start;
    iVar5 = (int)*(undefined8 *)(*(long *)((long)uc + 0x290) + 8);
    if (((ulong)(long)-iVar5 <= uVar11) ||
       (((ulong)(long)(-3 - iVar5) <= uVar11 && (_Var3 = insn_crosses_page(local_38,pDVar2), _Var3))
       )) {
      (pDVar2->base).is_jmp = DISAS_TOO_MANY;
    }
  }
  return;
}

Assistant:

static void thumb_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUARMState *env = cpu->env_ptr;
    uint32_t insn;
    bool is_16bit;
    uint32_t insn_size;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
        return;
    }

    dc->pc_curr = dc->base.pc_next;
    insn = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);
    is_16bit = thumb_insn_is_16bit(dc, dc->base.pc_next, insn);
    dc->base.pc_next += 2;
    if (!is_16bit) {
        uint32_t insn2 = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);

        insn = insn << 16 | insn2;
        dc->base.pc_next += 2;
    }
    dc->insn = insn;

    if (dc->condexec_mask && !thumb_insn_is_unconditional(dc, insn)) {
        uint32_t cond = dc->condexec_cond;

        /*
         * Conditionally skip the insn. Note that both 0xe and 0xf mean
         * "always"; 0xf is not "never".
         */
        if (cond < 0x0e) {
            arm_skip_unless(dc, cond);
        }
    }
    
    // Unicorn:
    //   We can't stop in the middle of the IT block.
    //   In other words, treat the whole IT block as
    //   a single instruction.
    uc->no_exit_request = (dc->condexec_mask != 0);

    // Unicorn: trace this instruction on request
    insn_size = is_16bit ? 2 : 4;
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->base.pc_next - insn_size)) {
        
        // Sync PC in advance
        gen_set_pc_im(dc, dc->base.pc_next - insn_size);

        if (uc->no_exit_request) {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX | UC_HOOK_FLAG_NO_STOP, uc, dc->base.pc_next - insn_size);
        } else {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, uc, dc->base.pc_next - insn_size);
        }
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    if (is_16bit) {
        disas_thumb_insn(dc, insn);
    } else {
        disas_thumb2_insn(dc, insn);
    }

    /* Advance the Thumb condexec condition.  */
    if (dc->condexec_mask) {
        dc->condexec_cond = ((dc->condexec_cond & 0xe) |
                             ((dc->condexec_mask >> 4) & 1));
        dc->condexec_mask = (dc->condexec_mask << 1) & 0x1f;
        if (dc->condexec_mask == 0) {
            dc->condexec_cond = 0;
        }
    }

    arm_post_translate_insn(dc);

    /* Thumb is a variable-length ISA.  Stop translation when the next insn
     * will touch a new page.  This ensures that prefetch aborts occur at
     * the right place.
     *
     * We want to stop the TB if the next insn starts in a new page,
     * or if it spans between this page and the next. This means that
     * if we're looking at the last halfword in the page we need to
     * see if it's a 16-bit Thumb insn (which will fit in this TB)
     * or a 32-bit Thumb insn (which won't).
     * This is to avoid generating a silly TB with a single 16-bit insn
     * in it at the end of this page (which would execute correctly
     * but isn't very efficient).
     */
    if (dc->base.is_jmp == DISAS_NEXT
        && (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE
            || (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE - 3
                && insn_crosses_page(env, dc)))) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}